

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderToolsCommon.cpp
# Opt level: O3

string * Diligent::UnrollShaderIncludesImpl
                   (string *__return_storage_ptr__,ShaderCreateInfo ShaderCI,
                   unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *AllIncludes)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  byte *pbVar4;
  string *psVar5;
  undefined4 extraout_var;
  undefined8 *puVar6;
  byte bVar7;
  long lVar8;
  char *pcVar9;
  anon_union_8_2_8aa5a88c_for_ShaderCreateInfo_4 aVar10;
  ShaderMacroArray *pSVar11;
  byte **ppbVar12;
  char *Pos;
  byte *pbVar13;
  byte *pbVar14;
  byte bVar15;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar16;
  char *pBufferEnd;
  __hashtable *__h;
  string UnrolledInclude;
  ShaderSourceFileData SourceData;
  stringstream Stream;
  ShaderCreateInfo in_stack_fffffffffffffbe8;
  byte *local_380;
  byte *local_378;
  byte *local_370;
  string *local_368;
  byte *local_360 [2];
  long local_350 [2];
  byte *local_340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_338;
  string local_330;
  ShaderMacroArray *local_310;
  ShaderSourceFileData local_308;
  byte *local_2f0;
  IShaderSourceInputStreamFactory *local_2e8;
  undefined8 local_2e0;
  void *local_2d8;
  undefined8 local_2d0;
  undefined8 local_2c8 [14];
  code *local_258;
  undefined1 local_250 [152];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  bVar15 = 0;
  ReadShaderSourceFile
            (&local_308,ShaderCI.Source,ShaderCI.field_4.SourceLength,
             ShaderCI.pShaderSourceStreamFactory,ShaderCI.FilePath);
  ShaderCI.Source = local_308.Source;
  aVar10.SourceLength._4_4_ = 0;
  aVar10.SourceLength._0_4_ = local_308.SourceLength;
  ShaderCI.FilePath = (Char *)0x0;
  ShaderCI.field_4 = aVar10;
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_258 = ProcessIncludeErrorHandler;
  memcpy(local_250,&ShaderCI,0x98);
  if (aVar10.SourceLength == 0) {
    pbVar4 = (byte *)0x0;
  }
  else {
    local_380 = (byte *)local_308.Source;
    local_370 = (byte *)(local_308.Source + aVar10.SourceLength);
    local_310 = (ShaderMacroArray *)&ShaderCI.EntryPoint;
    local_340 = (byte *)0x0;
    pbVar3 = (byte *)local_308.Source;
    local_338 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)AllIncludes;
    do {
      while( true ) {
        local_380 = (byte *)Parsing::SkipDelimitersAndComments<char_const*>
                                      ((char **)&local_380,(char **)&local_370,(char *)0x0,
                                       SKIP_COMMENT_FLAG_ALL);
        pbVar4 = local_340;
        local_308.Source = ShaderCI.Source;
        if (local_380 == local_370) goto LAB_0029c692;
        pbVar13 = local_380;
        if (*local_380 == 0x23) break;
        local_380 = local_380 + 1;
        if (local_370 <= local_380) goto LAB_0029c692;
      }
      do {
        if ((*pbVar13 < 0xe) && (pbVar14 = pbVar13, (0x2401U >> (*pbVar13 & 0x1f) & 1) != 0)) break;
        pbVar13 = pbVar13 + 1;
        pbVar14 = local_370;
      } while (pbVar13 != local_370);
      local_2f0 = local_380 + 1;
      local_378 = pbVar3;
      local_368 = __return_storage_ptr__;
      pbVar3 = (byte *)Parsing::SkipDelimitersAndComments<char_const*>
                                 ((char **)&local_2f0,(char **)&local_370," \t",
                                  SKIP_COMMENT_FLAG_MULTILINE);
      pbVar13 = local_370;
      pbVar4 = local_340;
      local_308.Source = ShaderCI.Source;
      local_380 = pbVar3;
      if (pbVar3 == local_370) break;
      if ((pbVar3 < pbVar14) &&
         (iVar2 = strncmp((char *)pbVar3,"include",7), local_380 = pbVar14, iVar2 == 0)) {
        local_380 = pbVar3 + 7;
        pbVar4 = (byte *)Parsing::SkipDelimitersAndComments<char_const*>
                                   ((char **)&local_380,(char **)&local_370," \t",
                                    SKIP_COMMENT_FLAG_MULTILINE);
        if (pbVar4 == local_370) {
          puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
          *puVar6 = local_380;
          puVar6[1] = "Unexpected end of file.";
          __cxa_throw(puVar6,&std::pair<char_const*,char_const*>::typeinfo,0);
        }
        if (pbVar14 <= pbVar4) {
          puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
          *puVar6 = pbVar14;
          puVar6[1] = "New line in the include directive.";
          __cxa_throw(puVar6,&std::pair<char_const*,char_const*>::typeinfo,0);
        }
        bVar1 = *pbVar4;
        local_380 = pbVar4;
        if (((pbVar4 < local_370) && (bVar1 != 0x22)) && (bVar1 != 0x3c)) {
          puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
          *puVar6 = local_380;
          puVar6[1] = "\'<\' or \'\"\' is expected";
          __cxa_throw(puVar6,&std::pair<char_const*,char_const*>::typeinfo,0);
        }
        bVar7 = 0x22;
        if (bVar1 == 0x3c) {
          bVar7 = 0x3e;
        }
        do {
          local_380 = local_380 + 1;
          if (local_370 <= local_380) break;
        } while (bVar7 != *local_380);
        if (local_380 == local_370) {
          puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
          pcVar9 = "Unable to find the matching closing quote";
          if (bVar1 == 0x3c) {
            pcVar9 = "Unable to find the matching angle bracket";
          }
          *puVar6 = pbVar4;
          puVar6[1] = pcVar9;
          __cxa_throw(puVar6,&std::pair<char_const*,char_const*>::typeinfo,0);
        }
        if (pbVar14 <= local_380) {
          puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
          *puVar6 = pbVar14;
          puVar6[1] = "New line in the file name.";
          __cxa_throw(puVar6,&std::pair<char_const*,char_const*>::typeinfo,0);
        }
        local_360[0] = (byte *)local_350;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_360,pbVar4 + 1);
        pbVar4 = local_380;
        std::ostream::write((char *)local_1a8,(long)(ShaderCI.Source + (long)local_340));
        local_330._M_dataplus._M_p = (pointer)local_338;
        pVar16 = std::
                 _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                 ::
                 _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                           ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                             *)local_338,(string *)local_360,&local_330);
        if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pSVar11 = local_310;
          puVar6 = local_2c8;
          for (lVar8 = 0xe; lVar8 != 0; lVar8 = lVar8 + -1) {
            *puVar6 = pSVar11->Elements;
            pSVar11 = (ShaderMacroArray *)&pSVar11[-(ulong)bVar15].Count;
            puVar6 = puVar6 + (ulong)bVar15 * -2 + 1;
          }
          local_2f0 = local_360[0];
          local_2e8 = ShaderCI.pShaderSourceStreamFactory;
          local_2e0 = 0;
          local_2d8 = ShaderCI.ByteCode;
          local_2d0 = 0;
          ppbVar12 = &local_2f0;
          puVar6 = (undefined8 *)&stack0xfffffffffffffbe8;
          for (lVar8 = 0x13; lVar8 != 0; lVar8 = lVar8 + -1) {
            *puVar6 = *ppbVar12;
            ppbVar12 = ppbVar12 + (ulong)bVar15 * -2 + 1;
            puVar6 = puVar6 + (ulong)bVar15 * -2 + 1;
          }
          UnrollShaderIncludesImpl
                    (&local_330,in_stack_fffffffffffffbe8,
                     (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_338);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,local_330._M_dataplus._M_p,local_330._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_330._M_dataplus._M_p != &local_330.field_2) {
            operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
          }
        }
        if (local_360[0] != (byte *)local_350) {
          operator_delete(local_360[0],local_350[0] + 1);
        }
        local_340 = pbVar4 + (1 - (long)local_378);
        pbVar13 = local_370;
        local_380 = local_380 + 1;
      }
      pbVar4 = local_340;
      pbVar3 = local_378;
      local_308.Source = ShaderCI.Source;
      __return_storage_ptr__ = local_368;
    } while (local_380 < pbVar13);
  }
LAB_0029c692:
  std::ostream::write((char *)local_1a8,(long)((byte *)local_308.Source + (long)pbVar4));
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  psVar5 = (string *)std::ios_base::~ios_base(local_138);
  if (local_308.pFileData.m_pObject != (IDataBlob *)0x0) {
    iVar2 = (*((local_308.pFileData.m_pObject)->super_IObject)._vptr_IObject[2])();
    psVar5 = (string *)CONCAT44(extraout_var,iVar2);
  }
  return psVar5;
}

Assistant:

static std::string UnrollShaderIncludesImpl(ShaderCreateInfo ShaderCI, std::unordered_set<std::string>& AllIncludes) noexcept(false)
{
    const auto SourceData = ReadShaderSourceFile(ShaderCI);

    ShaderCI.Source       = SourceData.Source;
    ShaderCI.SourceLength = SourceData.SourceLength;
    ShaderCI.FilePath     = nullptr;

    std::stringstream Stream;
    size_t            PrevIncludeEnd = 0;

    FindIncludes(
        ShaderCI.Source, ShaderCI.SourceLength, [&](const std::string& Path, size_t IncludeStart, size_t IncludeEnd) {
            // Insert text before the include start
            Stream.write(ShaderCI.Source + PrevIncludeEnd, IncludeStart - PrevIncludeEnd);

            if (AllIncludes.insert(Path).second)
            {
                // Process the #include directive
                ShaderCreateInfo IncludeCI{ShaderCI};
                IncludeCI.Source       = nullptr;
                IncludeCI.SourceLength = 0;
                IncludeCI.FilePath     = Path.c_str();
                auto UnrolledInclude   = UnrollShaderIncludesImpl(IncludeCI, AllIncludes);
                Stream << UnrolledInclude;
            }

            PrevIncludeEnd = IncludeEnd;
        },
        std::bind(ProcessIncludeErrorHandler, ShaderCI, std::placeholders::_1));

    // Insert text after the last include
    Stream.write(ShaderCI.Source + PrevIncludeEnd, ShaderCI.SourceLength - PrevIncludeEnd);

    return Stream.str();
}